

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str_cat.cc
# Opt level: O0

Nonnull<char_*> absl::anon_unknown_5::Append(Nonnull<char_*> out,AlphaNum *x)

{
  size_type sVar1;
  size_type sVar2;
  Nullable<const_char_*> __src;
  void *in_RDI;
  char *after;
  
  sVar1 = AlphaNum::size((AlphaNum *)0x3b6a62);
  sVar2 = AlphaNum::size((AlphaNum *)0x3b6a7c);
  if (sVar2 != 0) {
    __src = AlphaNum::data((AlphaNum *)0x3b6a96);
    sVar2 = AlphaNum::size((AlphaNum *)0x3b6aa5);
    memcpy(in_RDI,__src,sVar2);
  }
  return (Nonnull<char_*>)((long)in_RDI + sVar1);
}

Assistant:

inline absl::Nonnull<char*> Append(absl::Nonnull<char*> out,
                                   const AlphaNum& x) {
  // memcpy is allowed to overwrite arbitrary memory, so doing this after the
  // call would force an extra fetch of x.size().
  char* after = out + x.size();
  if (x.size() != 0) {
    memcpy(out, x.data(), x.size());
  }
  return after;
}